

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.h
# Opt level: O2

void __thiscall Delay::Delay(Delay *this,unsigned_long _ms)

{
  long lVar1;
  long lVar2;
  
  Promise::Promise(&this->super_Promise);
  (this->super_Promise)._vptr_Promise = (_func_int **)&PTR_Tick_00108d08;
  this->ms = _ms;
  (this->target_time).__d.__r = 0;
  lVar1 = std::chrono::_V2::system_clock::now();
  lVar2 = this->ms * 1000000;
  (this->target_time).__d.__r = lVar1 + lVar2;
  timestamp();
  printf("Time diff: %f\n",(double)lVar2 / 1000000000.0);
  return;
}

Assistant:

explicit Delay(unsigned long _ms): ms(_ms), Promise() {
    const time_point& time = std::chrono::system_clock::now();
    target_time = time + std::chrono::milliseconds(ms);
    std::chrono::duration<double> duration = target_time - time;
    timestamp(); printf("Time diff: %f\n", duration.count());
  }